

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

int vtresize(int force,int newrow,int newcol)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  score *psVar5;
  video **ppvVar6;
  video *pvVar7;
  ulong uVar8;
  void *pvVar9;
  char *pcVar10;
  byte bVar11;
  video *pvVar12;
  ulong uVar13;
  long lVar14;
  
  iVar2 = ncol;
  iVar1 = nrow;
  if (newcol < 1 || newrow < 1) {
    return 0;
  }
  if (((force == 0 && ((vtresize_first_run ^ 1) & 1) == 0) && nrow == newrow) && ncol == newcol) {
    return 1;
  }
  if ((vtresize_first_run & 1) == 0) {
    blanks.v_hash = 0;
    blanks.v_flag = 0;
    blanks.v_color = 0;
    blanks._6_2_ = 0;
    blanks.v_cost = 0;
    blanks._12_4_ = 0;
    blanks.v_text = (char *)0x0;
  }
  else if ((nrow == newrow & vtresize_first_run) != 0) {
    bVar11 = 0;
    goto LAB_0010a23c;
  }
  iVar3 = nrow * 2 + -2;
  if (nrow == 0) {
    iVar3 = 0;
  }
  if (newrow < nrow) {
    uVar8 = (ulong)(newrow * 2 - 2);
    lVar14 = uVar8 * 0x18 + 0x10;
    for (; (int)uVar8 < nrow * 2 + -2; uVar8 = (ulong)((int)uVar8 + 1)) {
      free(*(void **)((long)&video->v_hash + lVar14));
      *(undefined8 *)((long)&video->v_hash + lVar14) = 0;
      lVar14 = lVar14 + 0x18;
    }
  }
  psVar5 = (score *)reallocarray(score,(ulong)(uint)newrow,(ulong)(uint)newrow * 0xc);
  if (psVar5 == (score *)0x0) {
    panic("out of memory in display code");
  }
  uVar8 = (ulong)(newrow - 1U);
  score = psVar5;
  ppvVar6 = (video **)reallocarray(vscreen,uVar8,8);
  if (ppvVar6 == (video **)0x0) {
    panic("out of memory in display code");
  }
  vscreen = ppvVar6;
  ppvVar6 = (video **)reallocarray(pscreen,uVar8,8);
  if (ppvVar6 == (video **)0x0) {
    panic("out of memory in display code");
  }
  pscreen = ppvVar6;
  pvVar7 = (video *)reallocarray(video,uVar8,0x30);
  if (pvVar7 == (video *)0x0) {
    panic("out of memory in display code");
  }
  lVar14 = (long)iVar3;
  pvVar12 = pvVar7 + lVar14;
  video = pvVar7;
  for (; lVar14 < (long)(ulong)((newrow - 1U) * 2); lVar14 = lVar14 + 1) {
    pvVar12->v_text = (char *)0x0;
    pvVar12->v_hash = 0;
    pvVar12->v_flag = 0;
    pvVar12->v_color = 0;
    *(undefined2 *)&pvVar12->field_0x6 = 0;
    *(undefined8 *)&pvVar12->v_cost = 0;
    pvVar12 = pvVar12 + 1;
  }
  for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
    vscreen[uVar13] = pvVar7;
    pscreen[uVar13] = pvVar7 + 1;
    pvVar7 = pvVar7 + 2;
  }
  bVar11 = vtresize_first_run ^ 1;
LAB_0010a23c:
  if (((iVar1 != newrow) || (iVar2 != newcol)) || (pcVar10 = blanks.v_text, (bVar11 & 1) != 0)) {
    uVar4 = newrow * 2 - 2;
    uVar13 = 0;
    uVar8 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar8 = uVar13;
    }
    for (; uVar8 * 0x18 - uVar13 != 0; uVar13 = uVar13 + 0x18) {
      pvVar9 = realloc(*(void **)((long)&video->v_text + uVar13),(ulong)(uint)newcol);
      if (pvVar9 == (void *)0x0) {
        panic("out of memory in display code");
      }
      *(void **)((long)&video->v_text + uVar13) = pvVar9;
    }
    pcVar10 = (char *)realloc(blanks.v_text,(ulong)(uint)newcol);
    if (pcVar10 == (char *)0x0) {
      panic("out of memory in display code");
    }
  }
  blanks.v_text = pcVar10;
  if (newrow < ttrow) {
    ttrow = newrow;
  }
  if (newcol < ttcol) {
    ttcol = newcol;
  }
  ncol = newcol;
  nrow = newrow;
  vtresize_first_run = 1;
  return 1;
}

Assistant:

int
vtresize(int force, int newrow, int newcol)
{
	int	 i;
	int	 rowchanged, colchanged;
	static	 int first_run = 1;
	struct video	*vp;

	if (newrow < 1 || newcol < 1)
		return (FALSE);

	rowchanged = (newrow != nrow);
	colchanged = (newcol != ncol);

#define TRYREALLOC(a, n) do {					\
		void *tmp;					\
		if ((tmp = realloc((a), (n))) == NULL) {	\
			panic("out of memory in display code");	\
		}						\
		(a) = tmp;					\
	} while (0)

#define TRYREALLOCARRAY(a, n, m) do {				\
		void *tmp;					\
		if ((tmp = reallocarray((a), (n), (m))) == NULL) {\
			panic("out of memory in display code");	\
		}						\
		(a) = tmp;					\
	} while (0)

	/* No update needed */
	if (!first_run && !force && !rowchanged && !colchanged)
		return (TRUE);

	if (first_run)
		memset(&blanks, 0, sizeof(blanks));

	if (rowchanged || first_run) {
		int vidstart;

		/*
		 * This is not pretty.
		 */
		if (nrow == 0)
			vidstart = 0;
		else
			vidstart = 2 * (nrow - 1);

		/*
		 * We're shrinking, free some internal data.
		 */
		if (newrow < nrow) {
			for (i = 2 * (newrow - 1); i < 2 * (nrow - 1); i++) {
				free(video[i].v_text);
				video[i].v_text = NULL;
			}
		}

		TRYREALLOCARRAY(score, newrow, newrow * sizeof(struct score));
		TRYREALLOCARRAY(vscreen, (newrow - 1), sizeof(struct video *));
		TRYREALLOCARRAY(pscreen, (newrow - 1), sizeof(struct video *));
		TRYREALLOCARRAY(video, (newrow - 1), 2 * sizeof(struct video));

		/*
		 * Zero-out the entries we just allocated.
		 */
		for (i = vidstart; i < 2 * (newrow - 1); i++)
			memset(&video[i], 0, sizeof(struct video));

		/*
		 * Reinitialize vscreen and pscreen arrays completely.
		 */
		vp = &video[0];
		for (i = 0; i < newrow - 1; ++i) {
			vscreen[i] = vp;
			++vp;
			pscreen[i] = vp;
			++vp;
		}
	}
	if (rowchanged || colchanged || first_run) {
		for (i = 0; i < 2 * (newrow - 1); i++)
			TRYREALLOC(video[i].v_text, newcol);
		TRYREALLOC(blanks.v_text, newcol);
	}

	nrow = newrow;
	ncol = newcol;

	if (ttrow > nrow)
		ttrow = nrow;
	if (ttcol > ncol)
		ttcol = ncol;

	first_run = 0;
	return (TRUE);
}